

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O3

void __thiscall jsonip::semantic_state::array_start(semantic_state *this)

{
  pointer ppVar1;
  helper *phVar2;
  pair<jsonip::holder,_const_jsonip::helper_*> local_28;
  
  pre(this);
  ppVar1 = (this->state).
           super__Vector_base<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  phVar2 = ppVar1[-1].second;
  (*phVar2->_vptr_helper[8])(phVar2,ppVar1 + -1);
  local_28.first.t = (void *)0x0;
  local_28.second = (helper *)0x0;
  std::
  vector<std::pair<jsonip::holder,jsonip::helper_const*>,std::allocator<std::pair<jsonip::holder,jsonip::helper_const*>>>
  ::emplace_back<std::pair<jsonip::holder,jsonip::helper_const*>>
            ((vector<std::pair<jsonip::holder,jsonip::helper_const*>,std::allocator<std::pair<jsonip::holder,jsonip::helper_const*>>>
              *)this,&local_28);
  return;
}

Assistant:

void array_start()
        {
            pre();
            state.back().second->array_start(state.back().first);
            state.push_back(state_t()); // adds a placeholder
        }